

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_SetTranslation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  DWORD DVar2;
  AActor *pAVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DWORD DVar4;
  TActorIterator<AActor> local_28;
  
  local_28.super_FActorIterator.base = (AActor *)0x0;
  if (it == (AActor *)0x0 || arg1 != -1) {
    if (arg1 - 1U < 0xfffe) {
      DVar4 = arg1 - 1U | 0x40000;
    }
    else {
      DVar4 = 0x30007;
      if (arg1 != 0x100007) {
        DVar4 = 0;
      }
    }
  }
  else {
    DVar4 = it->Translation;
  }
  local_28.super_FActorIterator.id = arg0;
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      return 0;
    }
    if (DVar4 == 0) {
      if ((it->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar1 = (**(it->super_DThinker).super_DObject._vptr_DObject)(it);
        (it->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar1);
      }
      DVar4 = *(DWORD *)(((it->super_DThinker).super_DObject.Class)->Defaults + 0x380);
    }
    it->Translation = DVar4;
  }
  else {
    pAVar3 = TActorIterator<AActor>::Next(&local_28);
    if (pAVar3 == (AActor *)0x0) {
      return 0;
    }
    do {
      DVar2 = DVar4;
      if (DVar4 == 0) {
        if ((pAVar3->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar1 = (**(pAVar3->super_DThinker).super_DObject._vptr_DObject)(pAVar3);
          (pAVar3->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
        }
        DVar2 = *(DWORD *)(((pAVar3->super_DThinker).super_DObject.Class)->Defaults + 0x380);
      }
      pAVar3->Translation = DVar2;
      pAVar3 = TActorIterator<AActor>::Next(&local_28);
    } while (pAVar3 != (AActor *)0x0);
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetTranslation)
// Thing_SetTranslation (tid, range)
{
	TActorIterator<AActor> iterator (arg0);
	int range;
	AActor *target;
	bool ok = false;

	if (arg1 == -1 && it != NULL)
	{
		range = it->Translation;
	}
	else if (arg1 >= 1 && arg1 < MAX_ACS_TRANSLATIONS)
	{
		range = TRANSLATION(TRANSLATION_LevelScripted, (arg1-1));
	}
	else if (arg1 == TRANSLATION_ICE)
	{
		range = TRANSLATION(TRANSLATION_Standard, 7);
	}
	else
	{
		range = 0;
	}

	if (arg0 == 0)
	{
		if (it != NULL)
		{
			ok = true;
			it->Translation = range==0? it->GetDefault()->Translation : range;
		}
	}
	else
	{
		while ( (target = iterator.Next ()) )
		{
			ok = true;
			target->Translation = range==0? target->GetDefault()->Translation : range;
		}
	}

	return ok;
}